

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O2

string * __thiscall
flatbuffers::jsons::JsonSchemaGenerator::GeneratedFileName
          (string *__return_storage_ptr__,JsonSchemaGenerator *this,string *path,string *file_name,
          IDLOptions *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,path,file_name);
  std::operator+(__return_storage_ptr__,&local_30,".schema.json");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratedFileName(const std::string &path,
                                const std::string &file_name,
                                const IDLOptions &options /* unused */) const {
    (void)options;
    return path + file_name + ".schema.json";
  }